

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ckh.c
# Opt level: O3

_Bool duckdb_je_ckh_insert(tsd_t *tsd,ckh_t *ckh,void *key,void *data)

{
  long *plVar1;
  rtree_ctx_t *rtree_ctx;
  ulong *puVar2;
  uintptr_t *puVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  uint uVar6;
  void *pvVar7;
  ckhc_t *aTab;
  uintptr_t uVar8;
  arena_t *paVar9;
  ulong uVar10;
  uintptr_t uVar11;
  undefined8 uVar12;
  int iVar13;
  _Bool _Var14;
  uint uVar15;
  ulong uVar16;
  ckhc_t *pcVar17;
  rtree_leaf_elm_t *prVar18;
  atomic_p_t arena;
  long lVar19;
  byte bVar20;
  ulong uVar21;
  uintptr_t uVar22;
  ulong uVar23;
  size_t usize;
  void *data_local;
  void *key_local;
  
  data_local = data;
  key_local = key;
  _Var14 = ckh_try_insert(ckh,&key_local,&data_local);
  if (!_Var14) {
    return false;
  }
  rtree_ctx = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
LAB_00cef035:
  uVar6 = ckh->lg_curbuckets;
  iVar13 = uVar6 + 2;
  do {
    bVar20 = (byte)(iVar13 + 1);
    uVar16 = 0x10L << (bVar20 & 0x3f);
    if (uVar16 < 0x3801) {
      uVar15 = (int)uVar16 + 0x3fU & 0x7fc0;
      if (uVar15 < 0x1001) {
        usize = duckdb_je_sz_index2size_tab[duckdb_je_sz_size2index_tab[uVar15 >> 3]];
      }
      else {
        uVar16 = (ulong)uVar15 * 2 - 1;
        lVar19 = 0x3f;
        if (uVar16 != 0) {
          for (; uVar16 >> lVar19 == 0; lVar19 = lVar19 + -1) {
          }
        }
        uVar16 = -1L << (0x3c - ((byte)lVar19 ^ 0x3f) & 0x3f);
        usize = ~uVar16 + (ulong)uVar15 & uVar16;
      }
      uVar21 = 0x4000;
      if (0x3fff < usize) goto LAB_00cef0e3;
    }
    else {
      uVar21 = 0x4000;
      if (0x4000 < uVar16) {
        if (uVar16 < 0x7000000000000001) {
          uVar21 = (0x20L << (bVar20 & 0x3f)) - 1;
          lVar19 = 0x3f;
          if (uVar21 != 0) {
            for (; uVar21 >> lVar19 == 0; lVar19 = lVar19 + -1) {
            }
          }
          uVar21 = -1L << (0x3c - ((byte)lVar19 ^ 0x3f) & 0x3f);
          uVar21 = ~uVar21 + uVar16 & uVar21;
        }
        else {
          uVar21 = 0;
        }
        if (uVar21 < uVar16) {
          return true;
        }
      }
LAB_00cef0e3:
      usize = 0;
      if (!CARRY8(duckdb_je_sz_large_pad,uVar21)) {
        usize = uVar21;
      }
    }
    if (usize + 0x8fffffffffffffff < 0x9000000000000000) {
      return true;
    }
    if (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level < '\x01') {
      arena.repr = tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_iarena;
      if ((tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_iarena == (arena_t *)0x0) &&
         (arena.repr = duckdb_je_arena_choose_hard(tsd,true),
         tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled == true)) {
        paVar9 = (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_slow).arena;
        if (paVar9 == (arena_t *)0x0) {
          duckdb_je_tcache_arena_associate
                    ((tsdn_t *)tsd,
                     &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_slow,
                     &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache,
                     (arena_t *)arena.repr);
        }
        else if (paVar9 != (arena_t *)arena.repr) {
          duckdb_je_tcache_arena_reassociate
                    ((tsdn_t *)tsd,
                     &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_slow,
                     &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache,
                     (arena_t *)arena.repr);
        }
      }
    }
    else {
      arena.repr = duckdb_je_arenas[0].repr;
      if (duckdb_je_arenas[0].repr == (void *)0x0) {
        arena.repr = duckdb_je_arena_init((tsdn_t *)tsd,0,&duckdb_je_arena_config_default);
      }
    }
    pcVar17 = (ckhc_t *)
              duckdb_je_arena_palloc
                        ((tsdn_t *)tsd,(arena_t *)arena.repr,usize,0x40,true,usize < 0x3801,
                         (tcache_t *)0x0);
    if (pcVar17 == (ckhc_t *)0x0) {
      return true;
    }
    uVar23 = (ulong)pcVar17 & 0xffffffffc0000000;
    uVar16 = (ulong)(((uint)((ulong)pcVar17 >> 0x1e) & 0xf) << 4);
    puVar2 = (ulong *)((long)&rtree_ctx->cache[0].leafkey + uVar16);
    uVar16 = *(ulong *)((long)&rtree_ctx->cache[0].leafkey + uVar16);
    uVar21 = uVar23;
    if (uVar16 == uVar23) {
      prVar18 = (rtree_leaf_elm_t *)((ulong)((uint)((ulong)pcVar17 >> 9) & 0x1ffff8) + puVar2[1]);
    }
    else if ((tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).l2_cache[0].
             leafkey == uVar23) {
      prVar18 = (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).l2_cache[0].
                leaf;
      (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).l2_cache[0].leafkey =
           uVar16;
      (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).l2_cache[0].leaf =
           (rtree_leaf_elm_t *)puVar2[1];
      *puVar2 = uVar23;
      puVar2[1] = (ulong)prVar18;
      prVar18 = (rtree_leaf_elm_t *)
                ((long)&(prVar18->le_bits).repr + (ulong)((uint)((ulong)pcVar17 >> 9) & 0x1ffff8));
    }
    else {
      lVar19 = 0x2d0;
      do {
        if (*(ulong *)((long)tsd + lVar19 + -8) == uVar23) {
          uVar10 = *(ulong *)(&tsd->
                               cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled
                             + lVar19);
          puVar4 = (undefined8 *)((long)tsd + lVar19 + -0x18);
          uVar12 = puVar4[1];
          puVar5 = (undefined8 *)((long)tsd + lVar19 + -8);
          *puVar5 = *puVar4;
          puVar5[1] = uVar12;
          *(ulong *)((long)tsd + lVar19 + -0x18) = uVar16;
          *(ulong *)((long)tsd + lVar19 + -0x10) = puVar2[1];
          *puVar2 = uVar23;
          puVar2[1] = uVar10;
          prVar18 = (rtree_leaf_elm_t *)(((uint)((ulong)pcVar17 >> 9) & 0x1ffff8) + uVar10);
          goto LAB_00cef1a5;
        }
        lVar19 = lVar19 + 0x10;
      } while (lVar19 != 0x340);
      prVar18 = duckdb_je_rtree_leaf_elm_lookup_hard
                          ((tsdn_t *)tsd,&duckdb_je_arena_emap_global.rtree,rtree_ctx,
                           (uintptr_t)pcVar17,true,false);
      uVar21 = *puVar2;
    }
LAB_00cef1a5:
    pvVar7 = duckdb_je_arenas
             [*(uint *)(((long)(prVar18->le_bits).repr << 0x10) >> 0x10 & 0xffffffffffffff80) &
              0xfff].repr;
    if (uVar21 == uVar23) {
      prVar18 = (rtree_leaf_elm_t *)((ulong)((uint)((ulong)pcVar17 >> 9) & 0x1ffff8) + puVar2[1]);
    }
    else if ((tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).l2_cache[0].
             leafkey == uVar23) {
      prVar18 = (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).l2_cache[0].
                leaf;
      (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).l2_cache[0].leafkey =
           uVar21;
      (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).l2_cache[0].leaf =
           (rtree_leaf_elm_t *)puVar2[1];
LAB_00cef3bc:
      *puVar2 = uVar23;
      puVar2[1] = (ulong)prVar18;
      prVar18 = (rtree_leaf_elm_t *)
                ((long)&(prVar18->le_bits).repr + (ulong)((uint)((ulong)pcVar17 >> 9) & 0x1ffff8));
    }
    else {
      lVar19 = 0x2d0;
      do {
        if (*(ulong *)((long)tsd + lVar19 + -8) == uVar23) {
          prVar18 = *(rtree_leaf_elm_t **)
                     (&tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled +
                     lVar19);
          puVar4 = (undefined8 *)((long)tsd + lVar19 + -0x18);
          uVar12 = puVar4[1];
          puVar5 = (undefined8 *)((long)tsd + lVar19 + -8);
          *puVar5 = *puVar4;
          puVar5[1] = uVar12;
          *(ulong *)((long)tsd + lVar19 + -0x18) = uVar21;
          *(ulong *)((long)tsd + lVar19 + -0x10) = puVar2[1];
          goto LAB_00cef3bc;
        }
        lVar19 = lVar19 + 0x10;
      } while (lVar19 != 0x340);
      prVar18 = duckdb_je_rtree_leaf_elm_lookup_hard
                          ((tsdn_t *)tsd,&duckdb_je_arena_emap_global.rtree,rtree_ctx,
                           (uintptr_t)pcVar17,true,false);
    }
    LOCK();
    plVar1 = (long *)((long)pvVar7 + 0x48);
    *plVar1 = *plVar1 + duckdb_je_sz_index2size_tab[(ulong)(prVar18->le_bits).repr >> 0x30];
    UNLOCK();
    aTab = ckh->tab;
    ckh->tab = pcVar17;
    ckh->lg_curbuckets = iVar13 - 1;
    _Var14 = ckh_rebuild(ckh,aTab);
    if (!_Var14) break;
    pcVar17 = ckh->tab;
    uVar21 = (ulong)pcVar17 & 0xffffffffc0000000;
    uVar16 = (ulong)(((uint)((ulong)pcVar17 >> 0x1e) & 0xf) << 4);
    puVar3 = (uintptr_t *)((long)&rtree_ctx->cache[0].leafkey + uVar16);
    uVar8 = *(uintptr_t *)((long)&rtree_ctx->cache[0].leafkey + uVar16);
    uVar22 = uVar21;
    if (uVar8 == uVar21) {
      prVar18 = (rtree_leaf_elm_t *)((ulong)((uint)((ulong)pcVar17 >> 9) & 0x1ffff8) + puVar3[1]);
    }
    else if ((tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).l2_cache[0].
             leafkey == uVar21) {
      prVar18 = (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).l2_cache[0].
                leaf;
      (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).l2_cache[0].leafkey =
           uVar8;
      (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).l2_cache[0].leaf =
           (rtree_leaf_elm_t *)puVar3[1];
      *puVar3 = uVar21;
      puVar3[1] = (uintptr_t)prVar18;
      prVar18 = (rtree_leaf_elm_t *)
                ((long)&(prVar18->le_bits).repr + (ulong)((uint)((ulong)pcVar17 >> 9) & 0x1ffff8));
    }
    else {
      lVar19 = 0x2d0;
      do {
        if (*(ulong *)((long)tsd + lVar19 + -8) == uVar21) {
          uVar11 = *(uintptr_t *)
                    (&tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled +
                    lVar19);
          puVar4 = (undefined8 *)((long)tsd + lVar19 + -0x18);
          uVar12 = puVar4[1];
          puVar5 = (undefined8 *)((long)tsd + lVar19 + -8);
          *puVar5 = *puVar4;
          puVar5[1] = uVar12;
          *(uintptr_t *)((long)tsd + lVar19 + -0x18) = uVar8;
          *(uintptr_t *)((long)tsd + lVar19 + -0x10) = puVar3[1];
          *puVar3 = uVar21;
          puVar3[1] = uVar11;
          prVar18 = (rtree_leaf_elm_t *)(((uint)((ulong)pcVar17 >> 9) & 0x1ffff8) + uVar11);
          goto LAB_00cef261;
        }
        lVar19 = lVar19 + 0x10;
      } while (lVar19 != 0x340);
      prVar18 = duckdb_je_rtree_leaf_elm_lookup_hard
                          ((tsdn_t *)tsd,&duckdb_je_arena_emap_global.rtree,rtree_ctx,
                           (uintptr_t)pcVar17,true,false);
      uVar22 = *puVar3;
    }
LAB_00cef261:
    pvVar7 = duckdb_je_arenas
             [*(uint *)(((long)(prVar18->le_bits).repr << 0x10) >> 0x10 & 0xffffffffffffff80) &
              0xfff].repr;
    if (uVar22 == uVar21) {
      prVar18 = (rtree_leaf_elm_t *)((ulong)((uint)((ulong)pcVar17 >> 9) & 0x1ffff8) + puVar3[1]);
    }
    else if ((tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).l2_cache[0].
             leafkey == uVar21) {
      prVar18 = (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).l2_cache[0].
                leaf;
      (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).l2_cache[0].leafkey =
           uVar22;
      (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).l2_cache[0].leaf =
           (rtree_leaf_elm_t *)puVar3[1];
LAB_00cef441:
      *puVar3 = uVar21;
      puVar3[1] = (uintptr_t)prVar18;
      prVar18 = (rtree_leaf_elm_t *)
                ((long)&(prVar18->le_bits).repr + (ulong)((uint)((ulong)pcVar17 >> 9) & 0x1ffff8));
    }
    else {
      lVar19 = 0x2d0;
      do {
        if (*(ulong *)((long)tsd + lVar19 + -8) == uVar21) {
          prVar18 = *(rtree_leaf_elm_t **)
                     (&tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled +
                     lVar19);
          puVar4 = (undefined8 *)((long)tsd + lVar19 + -0x18);
          uVar12 = puVar4[1];
          puVar5 = (undefined8 *)((long)tsd + lVar19 + -8);
          *puVar5 = *puVar4;
          puVar5[1] = uVar12;
          *(uintptr_t *)((long)tsd + lVar19 + -0x18) = uVar22;
          *(uintptr_t *)((long)tsd + lVar19 + -0x10) = puVar3[1];
          goto LAB_00cef441;
        }
        lVar19 = lVar19 + 0x10;
      } while (lVar19 != 0x340);
      prVar18 = duckdb_je_rtree_leaf_elm_lookup_hard
                          ((tsdn_t *)tsd,&duckdb_je_arena_emap_global.rtree,rtree_ctx,
                           (uintptr_t)pcVar17,true,false);
    }
    LOCK();
    plVar1 = (long *)((long)pvVar7 + 0x48);
    *plVar1 = *plVar1 - duckdb_je_sz_index2size_tab[(ulong)(prVar18->le_bits).repr >> 0x30];
    UNLOCK();
    arena_dalloc_no_tcache((tsdn_t *)tsd,pcVar17);
    ckh->tab = aTab;
    ckh->lg_curbuckets = uVar6;
    iVar13 = iVar13 + 1;
  } while( true );
  uVar21 = (ulong)aTab & 0xffffffffc0000000;
  uVar16 = (ulong)(((uint)((ulong)aTab >> 0x1e) & 0xf) << 4);
  puVar3 = (uintptr_t *)((long)&rtree_ctx->cache[0].leafkey + uVar16);
  uVar8 = *(uintptr_t *)((long)&rtree_ctx->cache[0].leafkey + uVar16);
  uVar22 = uVar21;
  if (uVar8 == uVar21) {
    prVar18 = (rtree_leaf_elm_t *)((ulong)((uint)((ulong)aTab >> 9) & 0x1ffff8) + puVar3[1]);
  }
  else if ((tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).l2_cache[0].
           leafkey == uVar21) {
    prVar18 = (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).l2_cache[0].
              leaf;
    (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).l2_cache[0].leafkey =
         uVar8;
    (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).l2_cache[0].leaf =
         (rtree_leaf_elm_t *)puVar3[1];
    *puVar3 = uVar21;
    puVar3[1] = (uintptr_t)prVar18;
    prVar18 = (rtree_leaf_elm_t *)
              ((long)&(prVar18->le_bits).repr + (ulong)((uint)((ulong)aTab >> 9) & 0x1ffff8));
  }
  else {
    lVar19 = 0x2d0;
    do {
      if (*(ulong *)((long)tsd + lVar19 + -8) == uVar21) {
        uVar11 = *(uintptr_t *)
                  (&tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled +
                  lVar19);
        puVar4 = (undefined8 *)((long)tsd + lVar19 + -0x18);
        uVar12 = puVar4[1];
        puVar5 = (undefined8 *)((long)tsd + lVar19 + -8);
        *puVar5 = *puVar4;
        puVar5[1] = uVar12;
        *(uintptr_t *)((long)tsd + lVar19 + -0x18) = uVar8;
        *(uintptr_t *)((long)tsd + lVar19 + -0x10) = puVar3[1];
        *puVar3 = uVar21;
        puVar3[1] = uVar11;
        prVar18 = (rtree_leaf_elm_t *)(((uint)((ulong)aTab >> 9) & 0x1ffff8) + uVar11);
        goto LAB_00cef6bb;
      }
      lVar19 = lVar19 + 0x10;
    } while (lVar19 != 0x340);
    prVar18 = duckdb_je_rtree_leaf_elm_lookup_hard
                        ((tsdn_t *)tsd,&duckdb_je_arena_emap_global.rtree,rtree_ctx,(uintptr_t)aTab,
                         true,false);
    uVar22 = *puVar3;
  }
LAB_00cef6bb:
  pvVar7 = duckdb_je_arenas
           [*(uint *)(((long)(prVar18->le_bits).repr << 0x10) >> 0x10 & 0xffffffffffffff80) & 0xfff]
           .repr;
  if (uVar22 == uVar21) {
    prVar18 = (rtree_leaf_elm_t *)((ulong)((uint)((ulong)aTab >> 9) & 0x1ffff8) + puVar3[1]);
  }
  else if ((tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).l2_cache[0].
           leafkey == uVar21) {
    prVar18 = (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).l2_cache[0].
              leaf;
    (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).l2_cache[0].leafkey =
         uVar22;
    (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).l2_cache[0].leaf =
         (rtree_leaf_elm_t *)puVar3[1];
LAB_00cef794:
    *puVar3 = uVar21;
    puVar3[1] = (uintptr_t)prVar18;
    prVar18 = (rtree_leaf_elm_t *)
              ((long)&(prVar18->le_bits).repr + (ulong)((uint)((ulong)aTab >> 9) & 0x1ffff8));
  }
  else {
    lVar19 = 0x2d0;
    do {
      if (*(ulong *)((long)tsd + lVar19 + -8) == uVar21) {
        prVar18 = *(rtree_leaf_elm_t **)
                   (&tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled +
                   lVar19);
        puVar4 = (undefined8 *)((long)tsd + lVar19 + -0x18);
        uVar12 = puVar4[1];
        puVar5 = (undefined8 *)((long)tsd + lVar19 + -8);
        *puVar5 = *puVar4;
        puVar5[1] = uVar12;
        *(uintptr_t *)((long)tsd + lVar19 + -0x18) = uVar22;
        *(uintptr_t *)((long)tsd + lVar19 + -0x10) = puVar3[1];
        goto LAB_00cef794;
      }
      lVar19 = lVar19 + 0x10;
    } while (lVar19 != 0x340);
    prVar18 = duckdb_je_rtree_leaf_elm_lookup_hard
                        ((tsdn_t *)tsd,&duckdb_je_arena_emap_global.rtree,rtree_ctx,(uintptr_t)aTab,
                         true,false);
  }
  LOCK();
  plVar1 = (long *)((long)pvVar7 + 0x48);
  *plVar1 = *plVar1 - duckdb_je_sz_index2size_tab[(ulong)(prVar18->le_bits).repr >> 0x30];
  UNLOCK();
  arena_dalloc_no_tcache((tsdn_t *)tsd,aTab);
  _Var14 = ckh_try_insert(ckh,&key_local,&data_local);
  if (!_Var14) {
    return false;
  }
  goto LAB_00cef035;
}

Assistant:

bool
ckh_insert(tsd_t *tsd, ckh_t *ckh, const void *key, const void *data) {
	bool ret;

	assert(ckh != NULL);
	assert(ckh_search(ckh, key, NULL, NULL));

#ifdef CKH_COUNT
	ckh->ninserts++;
#endif

	while (ckh_try_insert(ckh, &key, &data)) {
		if (ckh_grow(tsd, ckh)) {
			ret = true;
			goto label_return;
		}
	}

	ret = false;
label_return:
	return ret;
}